

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::param::JacobiPreconditioner::JacobiPreconditioner
          (JacobiPreconditioner *this,Matrix *M,bool symmetric)

{
  float *pfVar1;
  uint32_t x;
  uint x_00;
  float fVar2;
  float fVar3;
  
  FullVector::FullVector(&this->m_inverseDiagonal,M->m_width);
  if (s_print != (undefined *)0x0 && M->m_width != (M->m_array).m_base.size) {
    (*(code *)s_print)("\rASSERT: %s %s %d\n","M.isSquare()",
                       "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                       ,0x164b);
  }
  for (x_00 = 0; x_00 < M->m_width; x_00 = x_00 + 1) {
    fVar2 = sparse::Matrix::getCoefficient(M,x_00,x_00);
    if (symmetric) {
      fVar3 = 1.0;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        fVar3 = 1.0 / SQRT(ABS(fVar2));
      }
    }
    else {
      fVar3 = (float)(~-(uint)(fVar2 != 0.0) & 0x3f800000 |
                     (uint)(1.0 / fVar2) & -(uint)(fVar2 != 0.0));
    }
    pfVar1 = Array<float>::operator[]((Array<float> *)this,x_00);
    *pfVar1 = fVar3;
  }
  return;
}

Assistant:

JacobiPreconditioner(const sparse::Matrix &M, bool symmetric) : m_inverseDiagonal(M.width())
	{
		XA_ASSERT(M.isSquare());
		for (uint32_t x = 0; x < M.width(); x++) {
			float elem = M.getCoefficient(x, x);
			//XA_DEBUG_ASSERT( elem != 0.0f ); // This can be zero in the presence of zero area triangles.
			if (symmetric) {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / sqrtf(fabsf(elem)) : 1.0f;
			} else {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / elem : 1.0f;
			}
		}
	}